

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O0

int rw::getNextEdge(StripNode *n,int32 last)

{
  int local_20;
  int32 i;
  int32 last_local;
  StripNode *n_local;
  
  local_20 = 0;
  while( true ) {
    if (2 < local_20) {
      return -1;
    }
    if ((((byte)n->e[local_20].field_0x4 >> 3 & 1) != 0) && (local_20 != last)) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static int
getNextEdge(StripNode *n, int32 last)
{
	int32 i;
	for(i = 0; i < 3; i++)
		if(n->e[i].isStrip && i != last)
			return i;
	return -1;
}